

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

PCRE2_SPTR16
compile_char1_matchingpath
          (compiler_common *common,PCRE2_UCHAR16 type,PCRE2_SPTR16 cc,jump_list **backtracks,
          BOOL check_str_ptr)

{
  sljit_compiler *compiler_00;
  jump_list *pjVar1;
  uint uVar2;
  anon_union_4_3_f865021c_for_oc c_00;
  anon_union_4_3_f865021c_for_oc c_01;
  BOOL BVar3;
  sljit_jump *psVar4;
  sljit_label *psVar5;
  anon_union_4_3_f865021c_for_oc local_1dc;
  anon_union_4_3_f865021c_for_oc local_1d4;
  anon_union_4_3_f865021c_for_oc local_18c;
  anon_union_4_3_f865021c_for_oc local_184;
  jump_list *local_90;
  jump_list *end_list;
  sljit_jump *jump [3];
  undefined1 local_64 [8];
  compare_context context;
  uint bit;
  uint oc;
  uint c;
  int length;
  sljit_compiler *compiler;
  BOOL check_str_ptr_local;
  jump_list **backtracks_local;
  PCRE2_SPTR16 cc_local;
  PCRE2_UCHAR16 type_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  common_local = (compiler_common *)cc;
  switch(type) {
  case 6:
  case 7:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    read_char8_type(common,(uint)(type == 6));
    sljit_emit_op2(compiler_00,0x265,0,0,1,0,0x40,4);
    psVar4 = sljit_emit_jump(compiler_00,(uint)(type != 7));
    add_jump(compiler_00,backtracks,psVar4);
    break;
  case 8:
  case 9:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    read_char8_type(common,(uint)(type == 8));
    sljit_emit_op2(compiler_00,0x265,0,0,1,0,0x40,1);
    psVar4 = sljit_emit_jump(compiler_00,(uint)(type != 9));
    add_jump(compiler_00,backtracks,psVar4);
    break;
  case 10:
  case 0xb:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    read_char8_type(common,(uint)(type == 10));
    sljit_emit_op2(compiler_00,0x265,0,0,1,0,0x40,0x10);
    psVar4 = sljit_emit_jump(compiler_00,(uint)(type != 0xb));
    add_jump(compiler_00,backtracks,psVar4);
    break;
  case 0xc:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    read_char_range(common,common->nlmin,common->nlmax,1);
    if ((common->nltype == 0) && (0xff < common->newline)) {
      end_list = (jump_list *)
                 sljit_emit_cmp(compiler_00,1,1,0,0x40,(long)(int)(common->newline >> 8 & 0xff));
      local_90 = (jump_list *)0x0;
      if (common->mode == 4) {
        check_str_end(common,&local_90);
      }
      else {
        psVar4 = sljit_emit_cmp(compiler_00,3,2,0,0xd,0);
        add_jump(compiler_00,&local_90,psVar4);
      }
      sljit_emit_op1(compiler_00,0x23,1,0,0x82,0);
      psVar4 = sljit_emit_cmp(compiler_00,0,1,0,0x40,(long)(int)(common->newline & 0xff));
      add_jump(compiler_00,backtracks,psVar4);
      pjVar1 = local_90;
      psVar5 = sljit_emit_label(compiler_00);
      set_jumps(pjVar1,psVar5);
      pjVar1 = end_list;
      psVar5 = sljit_emit_label(compiler_00);
      sljit_set_label((sljit_jump *)pjVar1,psVar5);
    }
    else {
      check_newlinechar(common,common->nltype,backtracks,1);
    }
    break;
  case 0xd:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    sljit_emit_op2(compiler_00,0x60,2,0,2,0,0x40,2);
    break;
  case 0xe:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    sljit_emit_op2(compiler_00,0x60,2,0,2,0,0x40,2);
    break;
  default:
    break;
  case 0x11:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    read_char_range(common,common->bsr_nlmin,common->bsr_nlmax,0);
    end_list = (jump_list *)sljit_emit_cmp(compiler_00,1,1,0,0x40,0xd);
    local_90 = (jump_list *)0x0;
    if (common->mode == 4) {
      check_str_end(common,&local_90);
    }
    else {
      psVar4 = sljit_emit_cmp(compiler_00,3,2,0,0xd,0);
      add_jump(compiler_00,&local_90,psVar4);
    }
    sljit_emit_op1(compiler_00,0x23,1,0,0x82,0);
    jump[0] = sljit_emit_cmp(compiler_00,1,1,0,0x40,10);
    sljit_emit_op2(compiler_00,0x60,2,0,2,0,0x40,2);
    jump[1] = sljit_emit_jump(compiler_00,0x18);
    pjVar1 = end_list;
    psVar5 = sljit_emit_label(compiler_00);
    sljit_set_label((sljit_jump *)pjVar1,psVar5);
    check_newlinechar(common,common->bsr_nltype,backtracks,0);
    pjVar1 = local_90;
    psVar5 = sljit_emit_label(compiler_00);
    set_jumps(pjVar1,psVar5);
    psVar4 = jump[0];
    psVar5 = sljit_emit_label(compiler_00);
    sljit_set_label(psVar4,psVar5);
    psVar4 = jump[1];
    psVar5 = sljit_emit_label(compiler_00);
    sljit_set_label(psVar4,psVar5);
    break;
  case 0x12:
  case 0x13:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    read_char_range(common,9,0x3000,(uint)(type == 0x12));
    psVar4 = sljit_emit_jump(compiler_00,0x19);
    add_jump(compiler_00,&common->hspace,psVar4);
    sljit_set_current_flags(compiler_00,0x200);
    psVar4 = sljit_emit_jump(compiler_00,(uint)(type == 0x12));
    add_jump(compiler_00,backtracks,psVar4);
    break;
  case 0x14:
  case 0x15:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    read_char_range(common,10,0x2029,(uint)(type == 0x14));
    psVar4 = sljit_emit_jump(compiler_00,0x19);
    add_jump(compiler_00,&common->vspace,psVar4);
    sljit_set_current_flags(compiler_00,0x200);
    psVar4 = sljit_emit_jump(compiler_00,(uint)(type == 0x14));
    add_jump(compiler_00,backtracks,psVar4);
    break;
  case 0x1d:
  case 0x1e:
    if (((common->mode == 1) && (check_str_ptr != 0)) &&
       ((type == 0x1d ||
        ((BVar3 = char_has_othercase(common,cc), BVar3 == 0 ||
         (uVar2 = char_get_othercase_bit(common,cc), uVar2 != 0)))))) {
      sljit_emit_op2(compiler_00,0x60,2,0,2,0,0x40,2);
      psVar4 = sljit_emit_cmp(compiler_00,4,2,0,0xd,0);
      add_jump(compiler_00,backtracks,psVar4);
      local_64._0_4_ = 2;
      local_64._4_4_ = -1;
      context.length = 0;
      common_local = (compiler_common *)
                     byte_sequence_compare
                               (common,(uint)(type == 0x1e),cc,(compare_context *)local_64,
                                backtracks);
    }
    else {
      if (check_str_ptr != 0) {
        detect_partial_match(common,backtracks);
      }
      c_00.asuchars[1] = 0;
      c_00.asushort = *cc;
      if ((type == 0x1d) || (BVar3 = char_has_othercase(common,cc), BVar3 == 0)) {
        read_char_range(common,c_00.asint,c_00.asint,0);
        psVar4 = sljit_emit_cmp(compiler_00,1,1,0,0x40,(ulong)(uint)c_00.asint);
        add_jump(compiler_00,backtracks,psVar4);
        common_local = (compiler_common *)(cc + 1);
      }
      else {
        context.oc.asint = char_othercase(common,c_00.asint);
        local_184.asint = context.oc.asint;
        if ((uint)c_00 < (uint)context.oc) {
          local_184 = c_00;
        }
        local_18c.asint = context.oc.asint;
        if ((uint)context.oc < (uint)c_00) {
          local_18c = c_00;
        }
        read_char_range(common,local_184.asint,local_18c.asint,0);
        context.c.asint = c_00.asint ^ context.oc.asint;
        BVar3 = is_powerof2(context.c.asint);
        if (BVar3 == 0) {
          end_list = (jump_list *)sljit_emit_cmp(compiler_00,0,1,0,0x40,(ulong)(uint)c_00.asint);
          psVar4 = sljit_emit_cmp(compiler_00,1,1,0,0x40,(ulong)(uint)context.oc.asint);
          add_jump(compiler_00,backtracks,psVar4);
          pjVar1 = end_list;
          psVar5 = sljit_emit_label(compiler_00);
          sljit_set_label((sljit_jump *)pjVar1,psVar5);
          common_local = (compiler_common *)(cc + 1);
        }
        else {
          sljit_emit_op2(compiler_00,0x66,1,0,1,0,0x40,(ulong)(uint)context.c.asint);
          psVar4 = sljit_emit_cmp(compiler_00,1,1,0,0x40,(ulong)(uint)(c_00.asint | context.c.asint)
                                 );
          add_jump(compiler_00,backtracks,psVar4);
          common_local = (compiler_common *)(cc + 1);
        }
      }
    }
    break;
  case 0x1f:
  case 0x20:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    c_01.asuchars[1] = 0;
    c_01.asushort = *cc;
    if ((type == 0x1f) || (BVar3 = char_has_othercase(common,cc), BVar3 == 0)) {
      read_char_range(common,c_01.asint,c_01.asint,1);
      psVar4 = sljit_emit_cmp(compiler_00,0,1,0,0x40,(ulong)(uint)c_01.asint);
      add_jump(compiler_00,backtracks,psVar4);
    }
    else {
      context.oc.asint = char_othercase(common,c_01.asint);
      local_1d4.asint = context.oc.asint;
      if ((uint)c_01 < (uint)context.oc) {
        local_1d4 = c_01;
      }
      local_1dc.asint = context.oc.asint;
      if ((uint)context.oc < (uint)c_01) {
        local_1dc = c_01;
      }
      read_char_range(common,local_1d4.asint,local_1dc.asint,1);
      context.c.asint = c_01.asint ^ context.oc.asint;
      BVar3 = is_powerof2(context.c.asint);
      if (BVar3 == 0) {
        psVar4 = sljit_emit_cmp(compiler_00,0,1,0,0x40,(ulong)(uint)c_01.asint);
        add_jump(compiler_00,backtracks,psVar4);
        psVar4 = sljit_emit_cmp(compiler_00,0,1,0,0x40,(ulong)(uint)context.oc.asint);
        add_jump(compiler_00,backtracks,psVar4);
      }
      else {
        sljit_emit_op2(compiler_00,0x66,1,0,1,0,0x40,(ulong)(uint)context.c.asint);
        psVar4 = sljit_emit_cmp(compiler_00,0,1,0,0x40,(ulong)(uint)(c_01.asint | context.c.asint));
        add_jump(compiler_00,backtracks,psVar4);
      }
    }
    common_local = (compiler_common *)(cc + 1);
    break;
  case 0x6e:
  case 0x6f:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    read_char_range(common,0,0xff,(uint)(type == 0x6f));
    BVar3 = optimize_class(common,(sljit_u8 *)cc,(uint)(type == 0x6f),0,backtracks);
    if (BVar3 == 0) {
      end_list = (jump_list *)sljit_emit_cmp(compiler_00,4,1,0,0x40,0xff);
      if (type == 0x6e) {
        add_jump(compiler_00,backtracks,(sljit_jump *)end_list);
        end_list = (jump_list *)0x0;
      }
      sljit_emit_op2(compiler_00,0x65,4,0,1,0,0x40,7);
      sljit_emit_op2(compiler_00,0x69,1,0,1,0,0x40,3);
      sljit_emit_op1(compiler_00,0x21,1,0,0x81,(sljit_sw)cc);
      sljit_emit_op2(compiler_00,0x68,4,0,0x40,1,4,0);
      sljit_emit_op2(compiler_00,0x265,0,0,1,0,4,0);
      psVar4 = sljit_emit_jump(compiler_00,0);
      add_jump(compiler_00,backtracks,psVar4);
      pjVar1 = end_list;
      if (end_list != (jump_list *)0x0) {
        psVar5 = sljit_emit_label(compiler_00);
        sljit_set_label((sljit_jump *)pjVar1,psVar5);
      }
      common_local = (compiler_common *)(cc + 0x10);
    }
    else {
      common_local = (compiler_common *)(cc + 0x10);
    }
    break;
  case 0x70:
    if (check_str_ptr != 0) {
      detect_partial_match(common,backtracks);
    }
    compile_xclass_matchingpath(common,cc + 1,backtracks);
    common_local = (compiler_common *)(cc + (long)(int)(uint)*cc + -1);
  }
  return (PCRE2_SPTR16)common_local;
}

Assistant:

static PCRE2_SPTR compile_char1_matchingpath(compiler_common *common, PCRE2_UCHAR type, PCRE2_SPTR cc, jump_list **backtracks, BOOL check_str_ptr)
{
DEFINE_COMPILER;
int length;
unsigned int c, oc, bit;
compare_context context;
struct sljit_jump *jump[3];
jump_list *end_list;
#ifdef SUPPORT_UNICODE
PCRE2_UCHAR propdata[5];
#endif /* SUPPORT_UNICODE */

switch(type)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  /* Digits are usually 0-9, so it is worth to optimize them. */
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  if (common->utf && is_char7_bitset((const sljit_u8*)common->ctypes - cbit_length + cbit_digit, FALSE))
    read_char7_type(common, type == OP_NOT_DIGIT);
  else
#endif
    read_char8_type(common, type == OP_NOT_DIGIT);
    /* Flip the starting bit in the negative case. */
  OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, ctype_digit);
  add_jump(compiler, backtracks, JUMP(type == OP_DIGIT ? SLJIT_ZERO : SLJIT_NOT_ZERO));
  return cc;

  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  if (common->utf && is_char7_bitset((const sljit_u8*)common->ctypes - cbit_length + cbit_space, FALSE))
    read_char7_type(common, type == OP_NOT_WHITESPACE);
  else
#endif
    read_char8_type(common, type == OP_NOT_WHITESPACE);
  OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, ctype_space);
  add_jump(compiler, backtracks, JUMP(type == OP_WHITESPACE ? SLJIT_ZERO : SLJIT_NOT_ZERO));
  return cc;

  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  if (common->utf && is_char7_bitset((const sljit_u8*)common->ctypes - cbit_length + cbit_word, FALSE))
    read_char7_type(common, type == OP_NOT_WORDCHAR);
  else
#endif
    read_char8_type(common, type == OP_NOT_WORDCHAR);
  OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, ctype_word);
  add_jump(compiler, backtracks, JUMP(type == OP_WORDCHAR ? SLJIT_ZERO : SLJIT_NOT_ZERO));
  return cc;

  case OP_ANY:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  read_char_range(common, common->nlmin, common->nlmax, TRUE);
  if (common->nltype == NLTYPE_FIXED && common->newline > 255)
    {
    jump[0] = CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, (common->newline >> 8) & 0xff);
    end_list = NULL;
    if (common->mode != PCRE2_JIT_PARTIAL_HARD)
      add_jump(compiler, &end_list, CMP(SLJIT_GREATER_EQUAL, STR_PTR, 0, STR_END, 0));
    else
      check_str_end(common, &end_list);

    OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, common->newline & 0xff));
    set_jumps(end_list, LABEL());
    JUMPHERE(jump[0]);
    }
  else
    check_newlinechar(common, common->nltype, backtracks, TRUE);
  return cc;

  case OP_ALLANY:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH != 32
  if (common->utf)
    {
    OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
    OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
#if PCRE2_CODE_UNIT_WIDTH == 8 || PCRE2_CODE_UNIT_WIDTH == 16
#if PCRE2_CODE_UNIT_WIDTH == 8
    jump[0] = CMP(SLJIT_LESS, TMP1, 0, SLJIT_IMM, 0xc0);
    OP1(SLJIT_MOV_U8, TMP1, 0, SLJIT_MEM1(TMP1), (sljit_sw)PRIV(utf8_table4) - 0xc0);
    OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP1, 0);
#elif PCRE2_CODE_UNIT_WIDTH == 16
    jump[0] = CMP(SLJIT_LESS, TMP1, 0, SLJIT_IMM, 0xd800);
    OP2(SLJIT_AND, TMP1, 0, TMP1, 0, SLJIT_IMM, 0xfc00);
    OP2(SLJIT_SUB | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, SLJIT_IMM, 0xd800);
    OP_FLAGS(SLJIT_MOV, TMP1, 0, SLJIT_EQUAL);
    OP2(SLJIT_SHL, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
    OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP1, 0);
#endif
    JUMPHERE(jump[0]);
#endif /* PCRE2_CODE_UNIT_WIDTH == [8|16] */
    return cc;
    }
#endif
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
  return cc;

  case OP_ANYBYTE:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
  return cc;

#ifdef SUPPORT_UNICODE
  case OP_NOTPROP:
  case OP_PROP:
  propdata[0] = XCL_HASPROP;
  propdata[1] = type == OP_NOTPROP ? XCL_NOTPROP : XCL_PROP;
  propdata[2] = cc[0];
  propdata[3] = cc[1];
  propdata[4] = XCL_END;
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  compile_xclass_matchingpath(common, propdata, backtracks);
  return cc + 2;
#endif

  case OP_ANYNL:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  read_char_range(common, common->bsr_nlmin, common->bsr_nlmax, FALSE);
  jump[0] = CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_CR);
  /* We don't need to handle soft partial matching case. */
  end_list = NULL;
  if (common->mode != PCRE2_JIT_PARTIAL_HARD)
    add_jump(compiler, &end_list, CMP(SLJIT_GREATER_EQUAL, STR_PTR, 0, STR_END, 0));
  else
    check_str_end(common, &end_list);
  OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
  jump[1] = CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_NL);
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
  jump[2] = JUMP(SLJIT_JUMP);
  JUMPHERE(jump[0]);
  check_newlinechar(common, common->bsr_nltype, backtracks, FALSE);
  set_jumps(end_list, LABEL());
  JUMPHERE(jump[1]);
  JUMPHERE(jump[2]);
  return cc;

  case OP_NOT_HSPACE:
  case OP_HSPACE:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  read_char_range(common, 0x9, 0x3000, type == OP_NOT_HSPACE);
  add_jump(compiler, &common->hspace, JUMP(SLJIT_FAST_CALL));
  sljit_set_current_flags(compiler, SLJIT_SET_Z);
  add_jump(compiler, backtracks, JUMP(type == OP_NOT_HSPACE ? SLJIT_NOT_ZERO : SLJIT_ZERO));
  return cc;

  case OP_NOT_VSPACE:
  case OP_VSPACE:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  read_char_range(common, 0xa, 0x2029, type == OP_NOT_VSPACE);
  add_jump(compiler, &common->vspace, JUMP(SLJIT_FAST_CALL));
  sljit_set_current_flags(compiler, SLJIT_SET_Z);
  add_jump(compiler, backtracks, JUMP(type == OP_NOT_VSPACE ? SLJIT_NOT_ZERO : SLJIT_ZERO));
  return cc;

#ifdef SUPPORT_UNICODE
  case OP_EXTUNI:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);

  SLJIT_ASSERT(TMP1 == SLJIT_R0 && STR_PTR == SLJIT_R1);
  OP1(SLJIT_MOV, SLJIT_R0, 0, ARGUMENTS, 0);

#if PCRE2_CODE_UNIT_WIDTH != 32
  sljit_emit_icall(compiler, SLJIT_CALL, SLJIT_RET(SW) | SLJIT_ARG1(SW) | SLJIT_ARG2(SW), SLJIT_IMM,
      common->utf ? SLJIT_FUNC_OFFSET(do_extuni_utf) : SLJIT_FUNC_OFFSET(do_extuni_no_utf));
#else
  sljit_emit_icall(compiler, SLJIT_CALL, SLJIT_RET(SW) | SLJIT_ARG1(SW) | SLJIT_ARG2(SW), SLJIT_IMM, SLJIT_FUNC_OFFSET(do_extuni_no_utf));
#endif

  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_RETURN_REG, 0);

  if (common->mode == PCRE2_JIT_PARTIAL_HARD)
    {
    jump[0] = CMP(SLJIT_LESS, SLJIT_RETURN_REG, 0, STR_END, 0);
    /* Since we successfully read a char above, partial matching must occure. */
    check_partial(common, TRUE);
    JUMPHERE(jump[0]);
    }
  return cc;
#endif

  case OP_CHAR:
  case OP_CHARI:
  length = 1;
#ifdef SUPPORT_UNICODE
  if (common->utf && HAS_EXTRALEN(*cc)) length += GET_EXTRALEN(*cc);
#endif
  if (common->mode == PCRE2_JIT_COMPLETE && check_str_ptr
      && (type == OP_CHAR || !char_has_othercase(common, cc) || char_get_othercase_bit(common, cc) != 0))
    {
    OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(length));
    add_jump(compiler, backtracks, CMP(SLJIT_GREATER, STR_PTR, 0, STR_END, 0));

    context.length = IN_UCHARS(length);
    context.sourcereg = -1;
#if defined SLJIT_UNALIGNED && SLJIT_UNALIGNED
    context.ucharptr = 0;
#endif
    return byte_sequence_compare(common, type == OP_CHARI, cc, &context, backtracks);
    }

  if (check_str_ptr)
    detect_partial_match(common, backtracks);
#ifdef SUPPORT_UNICODE
  if (common->utf)
    {
    GETCHAR(c, cc);
    }
  else
#endif
    c = *cc;

  if (type == OP_CHAR || !char_has_othercase(common, cc))
    {
    read_char_range(common, c, c, FALSE);
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, c));
    return cc + length;
    }
  oc = char_othercase(common, c);
  read_char_range(common, c < oc ? c : oc, c > oc ? c : oc, FALSE);
  bit = c ^ oc;
  if (is_powerof2(bit))
    {
    OP2(SLJIT_OR, TMP1, 0, TMP1, 0, SLJIT_IMM, bit);
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, c | bit));
    return cc + length;
    }
  jump[0] = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c);
  add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, oc));
  JUMPHERE(jump[0]);
  return cc + length;

  case OP_NOT:
  case OP_NOTI:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);

  length = 1;
#ifdef SUPPORT_UNICODE
  if (common->utf)
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    c = *cc;
    if (c < 128)
      {
      OP1(SLJIT_MOV_U8, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
      if (type == OP_NOT || !char_has_othercase(common, cc))
        add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c));
      else
        {
        /* Since UTF8 code page is fixed, we know that c is in [a-z] or [A-Z] range. */
        OP2(SLJIT_OR, TMP2, 0, TMP1, 0, SLJIT_IMM, 0x20);
        add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP2, 0, SLJIT_IMM, c | 0x20));
        }
      /* Skip the variable-length character. */
      OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));
      jump[0] = CMP(SLJIT_LESS, TMP1, 0, SLJIT_IMM, 0xc0);
      OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(TMP1), (sljit_sw)PRIV(utf8_table4) - 0xc0);
      OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP1, 0);
      JUMPHERE(jump[0]);
      return cc + 1;
      }
    else
#endif /* PCRE2_CODE_UNIT_WIDTH == 8 */
      {
      GETCHARLEN(c, cc, length);
      }
    }
  else
#endif /* SUPPORT_UNICODE */
    c = *cc;

  if (type == OP_NOT || !char_has_othercase(common, cc))
    {
    read_char_range(common, c, c, TRUE);
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c));
    }
  else
    {
    oc = char_othercase(common, c);
    read_char_range(common, c < oc ? c : oc, c > oc ? c : oc, TRUE);
    bit = c ^ oc;
    if (is_powerof2(bit))
      {
      OP2(SLJIT_OR, TMP1, 0, TMP1, 0, SLJIT_IMM, bit);
      add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c | bit));
      }
    else
      {
      add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, c));
      add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, oc));
      }
    }
  return cc + length;

  case OP_CLASS:
  case OP_NCLASS:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  bit = (common->utf && is_char7_bitset((const sljit_u8 *)cc, type == OP_NCLASS)) ? 127 : 255;
  read_char_range(common, 0, bit, type == OP_NCLASS);
#else
  read_char_range(common, 0, 255, type == OP_NCLASS);
#endif

  if (optimize_class(common, (const sljit_u8 *)cc, type == OP_NCLASS, FALSE, backtracks))
    return cc + 32 / sizeof(PCRE2_UCHAR);

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
  jump[0] = NULL;
  if (common->utf)
    {
    jump[0] = CMP(SLJIT_GREATER, TMP1, 0, SLJIT_IMM, bit);
    if (type == OP_CLASS)
      {
      add_jump(compiler, backtracks, jump[0]);
      jump[0] = NULL;
      }
    }
#elif PCRE2_CODE_UNIT_WIDTH != 8
  jump[0] = CMP(SLJIT_GREATER, TMP1, 0, SLJIT_IMM, 255);
  if (type == OP_CLASS)
    {
    add_jump(compiler, backtracks, jump[0]);
    jump[0] = NULL;
    }
#endif /* SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8 */

  OP2(SLJIT_AND, TMP2, 0, TMP1, 0, SLJIT_IMM, 0x7);
  OP2(SLJIT_LSHR, TMP1, 0, TMP1, 0, SLJIT_IMM, 3);
  OP1(SLJIT_MOV_U8, TMP1, 0, SLJIT_MEM1(TMP1), (sljit_sw)cc);
  OP2(SLJIT_SHL, TMP2, 0, SLJIT_IMM, 1, TMP2, 0);
  OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, TMP2, 0);
  add_jump(compiler, backtracks, JUMP(SLJIT_ZERO));

#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH != 8
  if (jump[0] != NULL)
    JUMPHERE(jump[0]);
#endif
  return cc + 32 / sizeof(PCRE2_UCHAR);

#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH == 16 || PCRE2_CODE_UNIT_WIDTH == 32
  case OP_XCLASS:
  if (check_str_ptr)
    detect_partial_match(common, backtracks);
  compile_xclass_matchingpath(common, cc + LINK_SIZE, backtracks);
  return cc + GET(cc, 0) - 1;
#endif
  }
SLJIT_UNREACHABLE();
return cc;
}